

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

bool __thiscall
imrt::EvaluationFunction::Zupdate
          (EvaluationFunction *this,int angle,int b,double delta_intensity,bool return_if_unfeasible
          ,vector<double,_std::allocator<double>_> *Zmax)

{
  size_t *psVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  int iVar8;
  iterator iVar9;
  Matrix *pMVar10;
  _List_node_base *p_Var11;
  _Base_ptr p_Var12;
  byte bVar13;
  byte bVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  _List_node_base *p_Var18;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  key_type local_68;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  
  local_68.second = b;
  local_68.first = angle;
  iVar9 = std::
          _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->beamlet2voxel_list)._M_h,&local_68);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)((long)iVar9.
                       super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
                       ._M_cur + 0x10));
  bVar16 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
           &local_60._M_impl.super__Rb_tree_header;
  if (!bVar16) {
    bVar13 = 1;
    bVar14 = 1;
    p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      iVar3 = *(int *)&p_Var12[1]._M_parent;
      p_Var7 = p_Var12[1]._M_parent;
      lVar15 = (long)*(int *)((long)&p_Var12[1]._M_parent + 4);
      pMVar10 = Volume::getDepositionMatrix
                          ((this->volumes->
                           super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                           super__Vector_impl_data._M_start + iVar3,angle);
      p_Var18 = (_List_node_base *)(pMVar10->p[lVar15][b] * delta_intensity);
      iVar8 = 3;
      if (((double)p_Var18 != 0.0) || (NAN((double)p_Var18))) {
        lVar4 = *(long *)&(this->Z).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar3].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        dVar17 = *(double *)(lVar4 + lVar15 * 8) + (double)p_Var18;
        pdVar2 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + iVar3;
        bVar5 = dVar17 != *pdVar2;
        bVar6 = *pdVar2 <= dVar17;
        bVar14 = bVar13;
        if (bVar6 && bVar5) {
          bVar14 = 0;
        }
        if (return_if_unfeasible && (bVar6 && bVar5)) {
          iVar8 = 1;
          bVar14 = 0;
          bVar13 = 0;
        }
        else {
          *(double *)(lVar4 + lVar15 * 8) = dVar17;
          p_Var11 = (_List_node_base *)operator_new(0x20);
          p_Var11[1]._M_next = (_List_node_base *)p_Var7;
          p_Var11[1]._M_prev = p_Var18;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          psVar1 = &(this->Z_diff).
                    super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          iVar8 = 0;
          bVar13 = bVar14;
        }
      }
      if ((iVar8 != 3) && (iVar8 != 0)) break;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      bVar16 = (_Rb_tree_header *)p_Var12 == &local_60._M_impl.super__Rb_tree_header;
    } while (!bVar16);
    bVar16 = (bool)(bVar16 & bVar14);
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&local_60);
  return bVar16;
}

Assistant:

bool EvaluationFunction::Zupdate(int angle, int b, double delta_intensity, bool return_if_unfeasible,
			vector<double>& Zmax){

	multimap<double, pair<int,int> > voxels = beamlet2voxel_list.at(make_pair(angle,b));
	bool feasible = true;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 if(Z[o][k] + delta > Zmax[o]){
			 feasible=false;
			 if(return_if_unfeasible) return feasible;
		 }

		 Z[o][k] += delta;
		 Z_diff.push_back(make_pair(make_pair(o,k),delta));
	 }

	 return feasible;
}